

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * __thiscall
CLI::App::help(string *__return_storage_ptr__,App *this,string *prev,AppFormatMode mode)

{
  App *this_00;
  element_type *peVar1;
  reference ppAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *prev_00;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  if (prev->_M_string_length == 0) {
    this_01 = &local_b0;
    ::std::__cxx11::string::string((string *)this_01,(string *)&this->name_);
    ::std::__cxx11::string::operator=((string *)prev,(string *)this_01);
  }
  else {
    ::std::__cxx11::string::string((string *)&local_90,(string *)&this->name_);
    ::std::operator+(&local_b0," ",&local_90);
    ::std::__cxx11::string::append((string *)prev);
    ::std::__cxx11::string::~string((string *)&local_b0);
    this_01 = &local_90;
  }
  ::std::__cxx11::string::~string((string *)this_01);
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_b0,&this->parsed_subcommands_
            );
  if (local_b0._M_dataplus._M_p == (pointer)local_b0._M_string_length) {
    peVar1 = (this->formatter_).super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    prev_00 = &local_70;
    ::std::__cxx11::string::string((string *)prev_00,(string *)prev);
    (*peVar1->_vptr_FormatterBase[2])(__return_storage_ptr__,peVar1,this,prev_00,(ulong)mode);
  }
  else {
    ppAVar2 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::at
                        ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_b0,0);
    this_00 = *ppAVar2;
    prev_00 = &local_50;
    ::std::__cxx11::string::string((string *)prev_00,(string *)prev);
    help(__return_storage_ptr__,this_00,prev_00,mode);
  }
  ::std::__cxx11::string::~string((string *)prev_00);
  std::_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>::~_Vector_base
            ((_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string help(std::string prev = "", AppFormatMode mode = AppFormatMode::Normal) const {
        if(prev.empty())
            prev = get_name();
        else
            prev += " " + get_name();

        // Delegate to subcommand if needed
        auto selected_subcommands = get_subcommands();
        if(!selected_subcommands.empty())
            return selected_subcommands.at(0)->help(prev, mode);
        else
            return formatter_->make_help(this, prev, mode);
    }